

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5MultiIterNextFrom(Fts5Index *p,Fts5Iter *pIter,i64 iMatch)

{
  int iVar1;
  i64 iVar2;
  i64 iRowid;
  i64 iMatch_local;
  Fts5Iter *pIter_local;
  Fts5Index *p_local;
  
  while( true ) {
    fts5MultiIterNext(p,pIter,1,iMatch);
    iVar1 = fts5MultiIterEof(p,pIter);
    if (iVar1 != 0) {
      return;
    }
    iVar2 = fts5MultiIterRowid(pIter);
    if ((pIter->bRev == 0) && (iMatch <= iVar2)) break;
    if ((pIter->bRev != 0) && (iVar2 <= iMatch)) {
      return;
    }
  }
  return;
}

Assistant:

static void fts5MultiIterNextFrom(
  Fts5Index *p, 
  Fts5Iter *pIter, 
  i64 iMatch
){
  while( 1 ){
    i64 iRowid;
    fts5MultiIterNext(p, pIter, 1, iMatch);
    if( fts5MultiIterEof(p, pIter) ) break;
    iRowid = fts5MultiIterRowid(pIter);
    if( pIter->bRev==0 && iRowid>=iMatch ) break;
    if( pIter->bRev!=0 && iRowid<=iMatch ) break;
  }
}